

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_stream.hpp
# Opt level: O0

void __thiscall
libtorrent::i2p_connection::
async_name_lookup<libtorrent::aux::torrent::tracker_response(libtorrent::aux::tracker_request_const&,boost::asio::ip::address_const&,std::__cxx11::list<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&,libtorrent::aux::tracker_response_const&)::__1>
          (i2p_connection *this,char *name,
          anon_class_16_1_89917c4a_for_m_underlying_handler *handler)

{
  anon_class_16_1_89917c4a_for_m_underlying_handler *paVar1;
  bool bVar2;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  __1 local_68 [39];
  allocator<char> local_41;
  string local_40;
  anon_class_16_1_89917c4a_for_m_underlying_handler *local_20;
  anon_class_16_1_89917c4a_for_m_underlying_handler *handler_local;
  char *name_local;
  i2p_connection *this_local;
  
  local_20 = handler;
  handler_local = (anon_class_16_1_89917c4a_for_m_underlying_handler *)name;
  name_local = (char *)this;
  if (((this->m_state == sam_idle) &&
      (bVar2 = ::std::__cxx11::
               list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>_>_>
               ::empty(&this->m_name_lookup), bVar2)) &&
     (bVar2 = is_open(this), paVar1 = handler_local, bVar2)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,(char *)paVar1,&local_41);
    libtorrent::aux::torrent::
    tracker_response(libtorrent::aux::tracker_request_const&,boost::asio::ip::address_const&,std::__cxx11::list<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&,libtorrent::aux::tracker_response_const&)
    ::$_1::__1(local_68,handler);
    do_name_lookup<libtorrent::aux::torrent::tracker_response(libtorrent::aux::tracker_request_const&,boost::asio::ip::address_const&,std::__cxx11::list<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&,libtorrent::aux::tracker_response_const&)::__1>
              (this,&local_40,(anon_class_16_1_89917c4a_for_m_underlying_handler *)local_68);
    libtorrent::aux::torrent::
    tracker_response(libtorrent::aux::tracker_request_const&,boost::asio::ip::address_const&,std::__cxx11::list<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&,libtorrent::aux::tracker_response_const&)
    ::$_1::~__1(local_68);
    ::std::__cxx11::string::~string((string *)&local_40);
    ::std::allocator<char>::~allocator(&local_41);
  }
  else {
    paVar1 = handler_local;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,(char *)paVar1,&local_89);
    ::std::__cxx11::
    list<std::pair<std::__cxx11::string,std::function<void(boost::system::error_code_const&,char_const*)>>,std::allocator<std::pair<std::__cxx11::string,std::function<void(boost::system::error_code_const&,char_const*)>>>>
    ::
    emplace_back<std::__cxx11::string,libtorrent::aux::torrent::tracker_response(libtorrent::aux::tracker_request_const&,boost::asio::ip::address_const&,std::__cxx11::list<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&,libtorrent::aux::tracker_response_const&)::__1>
              ((list<std::pair<std::__cxx11::string,std::function<void(boost::system::error_code_const&,char_const*)>>,std::allocator<std::pair<std::__cxx11::string,std::function<void(boost::system::error_code_const&,char_const*)>>>>
                *)&this->m_name_lookup,&local_88,handler);
    ::std::__cxx11::string::~string((string *)&local_88);
    ::std::allocator<char>::~allocator(&local_89);
  }
  return;
}

Assistant:

void async_name_lookup(char const* name, Handler handler)
	{
		if (m_state == sam_idle && m_name_lookup.empty() && is_open())
			do_name_lookup(name, std::move(handler));
		else
			m_name_lookup.emplace_back(std::string(name)
				, std::move(handler));
	}